

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

Closure * luaF_newLclosure(lua_State *L,int nelems,Table *e)

{
  GCObject *o;
  Closure *c;
  Table *e_local;
  int nelems_local;
  lua_State *L_local;
  
  o = (GCObject *)luaM_realloc_(L,(void *)0x0,0,(long)((nelems + -1) * 8 + 0x30));
  luaC_link(L,o,'\x06');
  (o->h).flags = '\0';
  (o->h).array = (TValue *)e;
  (o->h).lsizenode = (lu_byte)nelems;
  e_local._4_4_ = nelems;
  while (e_local._4_4_ != 0) {
    *(undefined8 *)((long)o + (long)(e_local._4_4_ + -1) * 8 + 0x28) = 0;
    e_local._4_4_ = e_local._4_4_ + -1;
  }
  return (Closure *)o;
}

Assistant:

Closure *luaF_newLclosure (lua_State *L, int nelems, Table *e) {
  Closure *c = cast(Closure *, luaM_malloc(L, sizeLclosure(nelems)));
  luaC_link(L, obj2gco(c), LUA_TFUNCTION);
  c->l.isC = 0;
  c->l.env = e;
  c->l.nupvalues = cast_byte(nelems);
  while (nelems--) c->l.upvals[nelems] = NULL;
  return c;
}